

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngstest.c
# Opt level: O3

void gpc_b16g(Pixel *out,Pixel *in,Background *back)

{
  uint uVar1;
  double dVar2;
  
  if (in->a < 1) {
    uVar1 = back->ig;
  }
  else {
    dVar2 = (double)in->a / 65535.0;
    dVar2 = (1.0 - dVar2) * back->dg + (double)in->g * (dVar2 / 65535.0);
    if (dVar2 <= 0.0031308) {
      dVar2 = dVar2 * 12.92;
    }
    else {
      dVar2 = pow(dVar2,0.4166666666666667);
      dVar2 = dVar2 * 1.055 + -0.055;
    }
    dVar2 = floor(dVar2 * 255.0 + 0.5);
    uVar1 = (int)dVar2 & 0xff;
  }
  out->b = uVar1;
  out->g = uVar1;
  out->r = uVar1;
  out->a = 0xff;
  return;
}

Assistant:

static void
gpc_b16g(Pixel *out, const Pixel *in, const Background *back)
{
   if (in->a <= 0)
      out->r = out->g = out->b = back->ig;

   else
   {
      double a = in->a/65535.;
      double a1 = 1-a;

      a /= 65535;
      out->r = out->g = out->b = sRGB(in->g * a + back->dg * a1);
   }

   out->a = 255;
}